

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor)

{
  EnumDescriptor *this_00;
  int iVar1;
  int iVar2;
  EnumValueDescriptor *pEVar3;
  EnumDescriptor *descriptor_00;
  EnumValueDescriptor *canonical_value;
  EnumValueDescriptor *value;
  int i;
  EnumDescriptor *local_18;
  EnumDescriptor *descriptor_local;
  EnumGenerator *this_local;
  
  this->descriptor_ = descriptor;
  local_18 = descriptor;
  descriptor_local = (EnumDescriptor *)this;
  std::
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::vector(&this->base_values_);
  std::
  vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ::vector(&this->all_values_);
  EnumName_abi_cxx11_(&this->name_,(objectivec *)this->descriptor_,descriptor_00);
  value._0_4_ = 0;
  while( true ) {
    iVar2 = (int)value;
    iVar1 = EnumDescriptor::value_count(this->descriptor_);
    if (iVar1 <= iVar2) break;
    canonical_value = EnumDescriptor::value(this->descriptor_,(int)value);
    this_00 = this->descriptor_;
    iVar2 = EnumValueDescriptor::number(canonical_value);
    pEVar3 = EnumDescriptor::FindValueByNumber(this_00,iVar2);
    if (canonical_value == pEVar3) {
      std::
      vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ::push_back(&this->base_values_,&canonical_value);
    }
    std::
    vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
    ::push_back(&this->all_values_,&canonical_value);
    value._0_4_ = (int)value + 1;
  }
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor)
    : descriptor_(descriptor),
      name_(EnumName(descriptor_)) {
  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      base_values_.push_back(value);
    }
    all_values_.push_back(value);
  }
}